

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NegaMaxSearch.h
# Opt level: O0

int negamax(int alpha,int beta,int depth)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  int iVar4;
  unsigned_long_long uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int nextPly;
  unsigned_long_long hashKeyCopy_1;
  int fiftyRuleCounterCopy_1;
  int castleCopy_1;
  int enpassantCopy_1;
  int sideCopy_1;
  unsigned_long_long occupanciesCopy_1 [3];
  unsigned_long_long bitboardsCopy_1 [12];
  int count;
  int movesSearched;
  moves moveList [1];
  int newScore;
  unsigned_long_long hashKeyCopy;
  int fiftyRuleCounterCopy;
  int castleCopy;
  int enpassantCopy;
  int sideCopy;
  unsigned_long_long occupanciesCopy [3];
  unsigned_long_long bitboardsCopy [12];
  int evalMargin;
  int staticEval;
  int legalMoves;
  int isInCheck;
  int pvNode;
  int hashFlag;
  int bestMove;
  int score;
  unsigned_long_long in_stack_fffffffffffffa68;
  int local_590;
  int local_58c;
  int local_584;
  undefined1 local_548 [4];
  int in_stack_fffffffffffffabc;
  int in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffb20;
  int iVar11;
  undefined4 in_stack_fffffffffffffb24;
  uint local_4d8 [9];
  int in_stack_fffffffffffffb4c;
  int in_stack_fffffffffffffb50;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int local_d8;
  undefined1 local_98 [104];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  uint depth_00;
  int in_stack_ffffffffffffffec;
  int local_8;
  int local_4;
  
  pvLength[ply] = ply;
  depth_00 = 0;
  local_1c = 1;
  local_58c = in_stack_ffffffffffffffec;
  if (((ply == 0) || (iVar7 = isRepetition(), local_58c = in_stack_ffffffffffffffec, iVar7 == 0)) &&
     (fiftyRuleCounter < 100)) {
    local_20 = (uint)(1 < in_ESI - in_EDI);
    if (((ply == 0) ||
        (local_58c = readHashEntry(in_EDI,in_ESI,(int *)&stack0xffffffffffffffe8,in_EDX),
        local_58c == 100000)) || (local_4 = local_58c, local_20 != 0)) {
      if ((nodes & 0x7ff) == 0) {
        communicate();
      }
      if (in_EDX == 0) {
        local_4 = quietSearch(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      }
      else if (ply < 0x40) {
        nodes = nodes + 1;
        if (side == 0) {
          getLSBIndex(in_stack_fffffffffffffa68);
        }
        else {
          getLSBIndex(in_stack_fffffffffffffa68);
        }
        local_24 = isSquareAttacked(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
        if (local_24 != 0) {
          in_EDX = in_EDX + 1;
        }
        local_28 = 0;
        local_2c = evaluate();
        if (((in_EDX < 3) && (local_20 == 0)) && (local_24 == 0)) {
          iVar7 = in_ESI + -1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          if ((-0xc2ec < iVar7) && (local_30 = in_EDX * 0x78, in_ESI <= local_2c + in_EDX * -0x78))
          {
            return local_2c + in_EDX * -0x78;
          }
        }
        if (((2 < in_EDX) && (local_24 == 0)) && (ply != 0)) {
          memcpy(local_98,bitboardsPieces,0x60);
          iVar10 = fiftyRuleCounter;
          uVar5 = hashKey;
          iVar9 = castle;
          iVar11 = enpassant;
          iVar7 = side;
          uVar3 = occupancies[2];
          uVar2 = occupancies[1];
          uVar1 = occupancies[0];
          ply = ply + 1;
          repetitionIndex = repetitionIndex + 1;
          repetitionTable[repetitionIndex] = hashKey;
          if (enpassant != 0x40) {
            hashKey = enpassantKeys[enpassant] ^ hashKey;
          }
          enpassant = 0x40;
          side = side ^ 1;
          hashKey = sideKey ^ hashKey;
          local_58c = negamax(in_EDX,local_58c,depth_00);
          local_58c = -local_58c;
          ply = ply + -1;
          repetitionIndex = repetitionIndex + -1;
          memcpy(bitboardsPieces,local_98,0x60);
          if (isStopped == 1) {
            occupancies[0] = uVar1;
            occupancies[1] = uVar2;
            occupancies[2] = uVar3;
            side = iVar7;
            enpassant = iVar11;
            castle = iVar9;
            hashKey = uVar5;
            fiftyRuleCounter = iVar10;
            return 0;
          }
          occupancies[0] = uVar1;
          occupancies[1] = uVar2;
          occupancies[2] = uVar3;
          side = iVar7;
          enpassant = iVar11;
          castle = iVar9;
          hashKey = uVar5;
          fiftyRuleCounter = iVar10;
          if (in_ESI <= local_58c) {
            return in_ESI;
          }
        }
        if (((local_20 == 0) && (local_24 == 0)) && (in_EDX < 4)) {
          local_590 = evaluate();
          local_58c = local_590 + 0x7d;
          if (local_58c < in_ESI) {
            if (in_EDX == 1) {
              iVar7 = quietSearch(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
              if (local_58c < iVar7) {
                local_58c = iVar7;
              }
              return local_58c;
            }
            local_590 = local_590 + 300;
            local_58c = local_590;
            if (((local_590 < in_ESI) && (in_EDX < 3)) &&
               (iVar7 = quietSearch(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c),
               local_58c = local_590, iVar7 < in_ESI)) {
              if (local_590 < iVar7) {
                local_590 = iVar7;
              }
              return local_590;
            }
          }
        }
        generateMoves((moves *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        if (followPV != 0) {
          enablePvScoring((moves *)local_4d8);
        }
        sortMoves((moves *)local_4d8,depth_00);
        iVar7 = 0;
        local_8 = in_EDI;
        for (iVar11 = 0; iVar11 < local_d8; iVar11 = iVar11 + 1) {
          memcpy(local_548,bitboardsPieces,0x60);
          iVar6 = fiftyRuleCounter;
          uVar5 = hashKey;
          iVar4 = castle;
          iVar10 = enpassant;
          iVar9 = side;
          uVar3 = occupancies[2];
          uVar2 = occupancies[1];
          uVar1 = occupancies[0];
          ply = ply + 1;
          repetitionIndex = repetitionIndex + 1;
          repetitionTable[repetitionIndex] = hashKey;
          iVar8 = makeMove(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
          if (iVar8 == 0) {
            ply = ply + -1;
            repetitionIndex = repetitionIndex + -1;
          }
          else {
            local_28 = local_28 + 1;
            if (iVar7 == 0) {
              local_58c = negamax(in_EDX,local_58c,depth_00);
              local_58c = -local_58c;
            }
            else {
              if ((((iVar7 < 4) || (in_EDX < 3)) || (local_24 != 0)) ||
                 (((local_4d8[iVar11] & 0x100000) != 0 ||
                  ((int)(local_4d8[iVar11] & 0xf0000) >> 0x10 != 0)))) {
                local_58c = local_8 + 1;
              }
              else {
                local_58c = negamax(in_EDX,local_58c,depth_00);
                local_58c = -local_58c;
              }
              if (local_8 < local_58c) {
                local_58c = negamax(in_EDX,local_58c,depth_00);
                local_58c = -local_58c;
                if ((local_8 < local_58c) && (local_58c < in_ESI)) {
                  local_58c = negamax(in_EDX,local_58c,depth_00);
                  local_58c = -local_58c;
                }
              }
            }
            ply = ply + -1;
            repetitionIndex = repetitionIndex + -1;
            memcpy(bitboardsPieces,local_548,0x60);
            if (isStopped == 1) {
              occupancies[0] = uVar1;
              occupancies[1] = uVar2;
              occupancies[2] = uVar3;
              side = iVar9;
              enpassant = iVar10;
              castle = iVar4;
              hashKey = uVar5;
              fiftyRuleCounter = iVar6;
              return 0;
            }
            iVar7 = iVar7 + 1;
            occupancies[0] = uVar1;
            occupancies[1] = uVar2;
            occupancies[2] = uVar3;
            side = iVar9;
            enpassant = iVar10;
            castle = iVar4;
            hashKey = uVar5;
            fiftyRuleCounter = iVar6;
            if (local_8 < local_58c) {
              local_1c = 0;
              depth_00 = local_4d8[iVar11];
              if ((local_4d8[iVar11] & 0x100000) == 0) {
                iVar9 = (int)(local_4d8[iVar11] & 0xf000) >> 0xc;
                iVar10 = (int)(local_4d8[iVar11] & 0xfc0) >> 6;
                historyMoves[iVar9][iVar10] = in_EDX + historyMoves[iVar9][iVar10];
              }
              pvTable[ply][ply] = local_4d8[iVar11];
              local_584 = ply;
              while (local_584 = local_584 + 1, local_584 < pvLength[ply + 1]) {
                pvTable[ply][local_584] = pvTable[ply + 1][local_584];
              }
              pvLength[ply] = pvLength[ply + 1];
              local_8 = local_58c;
              if (in_ESI <= local_58c) {
                writeHashEntry(in_ESI,depth_00,in_EDX,2);
                if ((local_4d8[iVar11] & 0x100000) != 0) {
                  return in_ESI;
                }
                killerMoves[1][ply] = killerMoves[0][ply];
                killerMoves[0][ply] = local_4d8[iVar11];
                return in_ESI;
              }
            }
          }
        }
        if (local_28 == 0) {
          if (local_24 == 0) {
            local_4 = 0;
          }
          else {
            local_4 = ply + -49000;
          }
        }
        else {
          writeHashEntry(local_8,depth_00,in_EDX,local_1c);
          local_4 = local_8;
        }
      }
      else {
        local_4 = evaluate();
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int negamax(int alpha, int beta, int depth) {
    // initializing length of current variation
    pvLength[ply] = ply;

    int score;

    int bestMove = 0;

    int hashFlag = ALPHA;

    if ((ply && isRepetition()) || fiftyRuleCounter >= 100) {
        // if repetition is found \ 50 move rule found -> return draw value
        return 0;
    }


    // checking if current node is PV or not
    int pvNode = beta - alpha > 1;


    if (ply && (score = readHashEntry(alpha, beta, &bestMove, depth)) != NO_HASH_FOUND && pvNode == 0) {
        // if search deep is bigger than 0 AND hash entry was found, AND current node is not a PV node -> return score found in entry
        return score;
    }


    if ((nodes & 2047) == 0) {
        // check for GUI/user input
        communicate();
    }


    if (depth == 0) {

        // no more depth to search in negamax, go to quiet search(escape condition)
        return quietSearch(alpha, beta);
    }


    if (ply > MAX_PLY - 1) {
        // in case we are to deep in the search -> return evaluation of the board
        return evaluate();
    }

    nodes++;

    // checking for checks
    int isInCheck = isSquareAttacked((side == WHITE) ? getLSBIndex(bitboardsPieces[K]) : getLSBIndex(bitboardsPieces[k]),
                                     side ^ 1);


    if (isInCheck) {
        // if in check -> scan deeper
        depth++;
    }


    int legalMoves = 0;



    // evaluation pruning / static null move pruning
    int staticEval = evaluate();
    if (depth < 3 && !pvNode && !isInCheck && abs(beta - 1) > -INFINITY + 100) {
        int evalMargin = 120 * depth;
        if (staticEval - evalMargin >= beta) {
            return staticEval - evalMargin;
        }

    }

    // null move pruning -> making another move from oppononet before continue evaluating to prune more moves
    if (depth >= 3 && isInCheck == 0 && ply) {

        copyBoard();
        ply++;

        // updating repetition table
        repetitionIndex++;
        repetitionTable[repetitionIndex] = hashKey;

        // switch sides and fix hashing for switching sides
        if (enpassant != NO_SQUARE)
            hashKey ^= enpassantKeys[enpassant];
        enpassant = NO_SQUARE;

        side ^= 1;
        hashKey ^= sideKey;

        // searching with smaller depth, with considiration on limit reduction
        score = -negamax(-beta, -beta + 1, depth - 1 - 2);


        ply--;
        repetitionIndex--;
        restoreBoard();


        if (isStopped == 1) {
            // flag to stop, quit searching
            return 0;
        }

        if (score >= beta) {
            // node (position) fails high
            return beta;
        }

    }

    // razoring
    if (!pvNode && !isInCheck && depth <= 3) {
        // get static eval and add first bonus
        score = evaluate() + 125;

        // define new score
        int newScore;

        // static evaluation indicates a fail-low node
        if (score < beta) {
            // on depth 1
            if (depth == 1) {
                // get quiscence score
                newScore = quietSearch(alpha, beta);

                // return quiescence score if it's greater then static evaluation score
                return (newScore > score) ? newScore : score;
            }

            // add second bonus to static evaluation
            score += 175;

            // static evaluation indicates a fail-low node
            if (score < beta && depth <= 2) {
                // get quiscence score
                newScore = quietSearch(alpha, beta);

                // quiescence score indicates fail-low node
                if (newScore < beta)
                    // return quiescence score if it's greater then static evaluation score
                    return (newScore > score) ? newScore : score;
            }
        }
    }


    moves moveList[1];
    generateMoves(moveList);


    if (followPV) {
        //following Principal variation Line(PV) ->  enable PV move scoring
        enablePvScoring(moveList);
    }

    sortMoves(moveList, bestMove);

    // number of moves searched in a move list
    int movesSearched = 0;


    for (int count = 0; count < moveList->count; count++) {

        copyBoard();
        ply++;

        // updating repetition table
        repetitionIndex++;
        repetitionTable[repetitionIndex] = hashKey;


        if (makeMove(moveList->moves[count], ALL_MOVES) == 0) {
            // if invalid move -> go back to another move
            ply--;
            repetitionIndex--;
            continue;
        }

        legalMoves++;


        if (movesSearched == 0) {
            // no search occured yet -> search normally
            score = -negamax(-beta, -alpha, depth - 1);
        }
            // Late Move Reduction
        else {
            // condition to consider LMR
            if (
                    movesSearched >= fullDepthMoves &&
                    depth >= reductionLimit &&
                    isInCheck == 0 &&
                    getMoveCapture(moveList->moves[count]) == 0 &&
                    getMovePromoted(moveList->moves[count]) == 0)
                // search current move with reduced depth:
                score = -negamax(-alpha - 1, -alpha, depth - 2);

                // ensure full depth is going to be done
            else
                score = alpha + 1;

            // principle variation search PVS
            if (score > alpha) {
                //Focusing on Principal Variation
                score = -negamax(-alpha - 1, -alpha, depth - 1);

                // If Reduction was wrong -> try and fixed it with search with more depth and normal alpha beta score bounds
                if ((score > alpha) && (score < beta)) {
                    score = -negamax(-beta, -alpha, depth - 1);
                }

            }
        }

        ply--;
        repetitionIndex--;
        restoreBoard();


        if (isStopped == 1) {
            // Stop search due to signal by user \ GUI
            return 0;
        }


        movesSearched++;


        if (score > alpha) {
            // found a better move -> mark this move as Principal variation Node
            hashFlag = PV;

            bestMove = moveList->moves[count];

            if (getMoveCapture(moveList->moves[count]) == 0) {
                // if not a capture -> store as history move
                historyMoves[getMovePiece(moveList->moves[count])][getMoveTarget(
                        moveList->moves[count])] += depth;

            }

            // PV node (position), writing it to PV table
            alpha = score;
            pvTable[ply][ply] = moveList->moves[count];
            for (int nextPly = ply + 1; nextPly < pvLength[ply + 1]; nextPly++) {
                // copy move from deeper ply into a current ply's line
                pvTable[ply][nextPly] = pvTable[ply + 1][nextPly];
            }
            pvLength[ply] = pvLength[ply + 1];


            if (score >= beta) {
                // storing move as beta
                writeHashEntry(beta, bestMove, depth, BETA);


                if (getMoveCapture(moveList->moves[count]) == 0) {
                    // on quiet moves -> store killer moves
                    killerMoves[1][ply] = killerMoves[0][ply];
                    killerMoves[0][ply] = moveList->moves[count];
                }

                // node (position) fails high
                return beta;
            }
        }
    }


    if (legalMoves == 0) {
        // we don't have any legal moves to make in the current postion -> check for mate or stalmate
        if (isInCheck) {
            // Mate: returning MATE_VALUE + ply to consider fast mate first
            return -MATE_VALUE + ply;
        } else {
            // StalMate ->  return draw score
            return 0;
        }

    }

    // store hash entry with the score equal to alpha
    writeHashEntry(alpha, bestMove, depth, hashFlag);

    // return fail low score
    return alpha;
}